

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O2

vec<float,_4> linalg::slerp<float,4>(vec<float,_4> *a,vec<float,_4> *b,float t)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  type tVar5;
  type tVar6;
  vec<float,_4> vVar7;
  float local_38;
  float fStack_34;
  float local_28;
  float fStack_24;
  
  fVar1 = uangle<float,4>(a,b);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar2 = sinf((1.0 - t) * fVar1);
    fVar3 = sinf(fVar1);
    tVar5 = detail::apply<linalg::detail::op_mul,void,linalg::vec<float,4>,float>::impl<0,1,2,3>
                      (fVar2 / fVar3,a);
    fVar2 = sinf(fVar1 * t);
    fVar1 = sinf(fVar1);
    tVar6 = detail::apply<linalg::detail::op_mul,void,linalg::vec<float,4>,float>::impl<0,1,2,3>
                      (fVar2 / fVar1,b);
    local_28 = tVar5.x;
    fStack_24 = tVar5.y;
    fVar1 = tVar6.x + local_28;
    fVar3 = tVar6.y + fStack_24;
    local_38 = tVar5.z;
    fStack_34 = tVar5.w;
    fVar2 = tVar6.z + local_38;
    fVar4 = tVar6.w + fStack_34;
  }
  else {
    fVar1 = a->x;
    fVar3 = a->y;
    fVar2 = a->z;
    fVar4 = a->w;
  }
  vVar7.y = fVar3;
  vVar7.x = fVar1;
  vVar7.w = fVar4;
  vVar7.z = fVar2;
  return vVar7;
}

Assistant:

vec<T,M>    slerp    (const vec<T,M> & a, const vec<T,M> & b, T t) { T th=uangle(a,b); return th == 0 ? a : a*(std::sin(th*(1-t))/std::sin(th)) + b*(std::sin(th*t)/std::sin(th)); }